

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsCompiler.cxx
# Opt level: O1

bool __thiscall
cmDependsCompiler::CheckDependencies
          (cmDependsCompiler *this,string *internalDepFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depFiles,DependencyMap *dependencies,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *isValidPath)

{
  pointer __s1;
  size_type sVar1;
  char *pcVar2;
  size_t sVar3;
  key_type *__k;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  istream *piVar11;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar12;
  string *psVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  mapped_type *pmVar15;
  long lVar16;
  cmGccStyleDependency *pcVar17;
  optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
  *__return_storage_ptr__;
  size_type __rlen;
  long lVar18;
  value_type *__x;
  _Iter_equals_val<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __pred;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string depender;
  string line;
  cmFileTime internalDepFileTime;
  cmFileTime depFileTime;
  ifstream fin;
  undefined1 local_318 [40];
  undefined1 local_2f0 [16];
  cmGccStyleDependency local_2e0;
  string *local_2b0;
  cmFileTime local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  cmGccStyleDependency *local_280;
  _Any_data local_278;
  code *local_268;
  _Any_data local_258;
  code *local_248;
  undefined1 local_238 [24];
  _Invoker_type local_220;
  byte local_218 [8];
  char *local_210;
  size_type local_208;
  pointer local_200;
  undefined8 local_1f8;
  char *local_1f0;
  
  local_2a8.Time = 0;
  local_2e0.rules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)isValidPath;
  local_2e0.paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)dependencies;
  local_2e0.paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  local_2b0 = internalDepFile;
  bVar6 = cmsys::SystemTools::FileExists(internalDepFile);
  psVar13 = local_2b0;
  if (bVar6) {
    cmFileTime::Load(&local_2a8,local_2b0);
    std::ifstream::ifstream((istream *)local_238,(psVar13->_M_dataplus)._M_p,_S_in);
    if ((local_218[(long)(((pointer)(local_238._0_8_ + -0x30))->paths).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start] & 5) == 0) {
      pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
      local_2f0._8_8_ = (cmGccStyleDependency *)0x0;
      local_2e0.rules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
      local_318._0_8_ = local_318 + 0x10;
      local_318._8_8_ = (pointer)0x0;
      local_318._16_8_ = local_318._16_8_ & 0xffffffffffffff00;
      local_2f0._0_8_ = &local_2e0;
      local_2e0.paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)depFiles;
      while( true ) {
        cVar7 = std::ios::widen((char)(((pointer)(local_238._0_8_ + -0x30))->paths).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                                (char)(istream *)local_238);
        piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)local_2f0,cVar7);
        if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) break;
        if ((((cmGccStyleDependency *)local_2f0._8_8_ != (cmGccStyleDependency *)0x0) &&
            (*(char *)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f0._0_8_)->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start != '#')) &&
           ((((undefined1 *)
             ((long)&(((cmGccStyleDependency *)(local_2f0._0_8_ + -0x30))->paths).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7))[local_2f0._8_8_] !=
             '\r' || (std::__cxx11::string::pop_back(),
                     (cmGccStyleDependency *)local_2f0._8_8_ != (cmGccStyleDependency *)0x0)))) {
          if (*(char *)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2f0._0_8_)->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start == ' ') {
            if (pvVar12 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0)
            {
              std::__cxx11::string::substr((ulong)&local_2a0,(ulong)local_2f0);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(pvVar12,&local_2a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
            }
          }
          else {
            std::__cxx11::string::operator=((string *)local_318,(string *)local_2f0);
            pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                    *)local_2e0.paths.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                   (key_type *)local_318);
          }
        }
      }
      std::ifstream::close();
      depFiles = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2e0.paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,(ulong)(local_318._16_8_ + 1));
      }
      if ((cmGccStyleDependency *)local_2f0._0_8_ != &local_2e0) {
        operator_delete((void *)local_2f0._0_8_,
                        CONCAT71(local_2e0.rules.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_2e0.rules.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
      }
    }
    std::ifstream::~ifstream(local_238);
  }
  local_2a0._M_dataplus._M_p = (pointer)0x0;
  __pred._M_value =
       (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&((pointer)depFiles)->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
  if (__pred._M_value == (pointer)((pointer)depFiles)->_M_string_length) {
    bVar9 = true;
  }
  else {
    bVar9 = true;
    local_2e0.paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)depFiles;
    do {
      psVar13 = __pred._M_value + 3;
      bVar8 = cmsys::SystemTools::FileExists(psVar13);
      if ((bVar8) &&
         ((!bVar6 ||
          (cmFileTime::Load((cmFileTime *)&local_2a0,psVar13),
          local_2a8.Time <= (long)local_2a0._M_dataplus._M_p)))) {
        if (*(bool *)&((local_2e0.paths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus)._M_p ==
            true) {
          local_220 = (_Invoker_type)__pred._M_value[3]._M_dataplus._M_p;
          local_238._16_8_ = __pred._M_value[3]._M_string_length;
          local_238._0_8_ = (pointer)0x13;
          local_238._8_8_ = "Dependencies file \"";
          local_218[0] = 0x1e;
          local_218[1] = 0;
          local_218[2] = 0;
          local_218[3] = 0;
          local_218[4] = 0;
          local_218[5] = 0;
          local_218[6] = 0;
          local_218[7] = 0;
          local_210 = "\" is newer than depends file \"";
          local_200 = (local_2b0->_M_dataplus)._M_p;
          local_208 = local_2b0->_M_string_length;
          local_1f8 = 3;
          local_1f0 = "\".\n";
          views._M_len = 5;
          views._M_array = (iterator)local_238;
          cmCatViews_abi_cxx11_((string *)local_2f0,views);
          cmSystemTools::Stdout((string *)local_2f0);
          if ((cmGccStyleDependency *)local_2f0._0_8_ != &local_2e0) {
            operator_delete((void *)local_2f0._0_8_,
                            CONCAT71(local_2e0.rules.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_2e0.rules.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
          }
        }
        local_318._0_8_ = (pointer)0x0;
        local_318._8_8_ = (pointer)0x0;
        local_318._16_8_ = (pointer)0x0;
        __s1 = __pred._M_value[2]._M_dataplus._M_p;
        sVar1 = __pred._M_value[2]._M_string_length;
        if (sVar1 == 3) {
          local_318._16_8_ = (pointer)0x0;
          local_318._8_8_ = (pointer)0x0;
          local_318._0_8_ = (pointer)0x0;
          iVar10 = bcmp(__s1,"gcc",3);
          if (iVar10 == 0) {
            pcVar2 = (psVar13->_M_dataplus)._M_p;
            psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                ((cmLocalGenerator *)
                                 (local_2e0.paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                 _M_string_length);
            __return_storage_ptr__ =
                 (optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                  *)local_238;
            cmReadGccDepfile(__return_storage_ptr__,pcVar2,psVar13,Deps);
            if ((local_220._0_1_ == false) ||
               (std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_318,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(local_238._0_8_ + 0x18)), uVar4 = local_318._0_8_,
               local_318._0_8_ == local_318._8_8_)) {
              if (local_220._0_1_ == true) {
                local_220 = (_Invoker_type)((ulong)local_220 & 0xffffffffffffff00);
LAB_00566133:
                std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                          ((vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *)
                           __return_storage_ptr__);
              }
            }
            else {
              sVar3 = *(size_type *)(local_318._0_8_ + 8);
              if ((sVar3 == __pred._M_value[1]._M_string_length) &&
                 ((sVar3 == 0 ||
                  (iVar10 = bcmp(((_Alloc_hider *)local_318._0_8_)->_M_p,
                                 __pred._M_value[1]._M_dataplus._M_p,sVar3), iVar10 == 0)))) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_318,(iterator)uVar4);
              }
              uVar4 = local_318._0_8_;
              sVar3 = *(size_type *)(local_318._0_8_ + 8);
              if ((sVar3 == (__pred._M_value)->_M_string_length) &&
                 ((sVar3 == 0 ||
                  (iVar10 = bcmp(((_Alloc_hider *)local_318._0_8_)->_M_p,
                                 ((__pred._M_value)->_M_dataplus)._M_p,sVar3), iVar10 == 0)))) {
                if ((_Manager_type)
                    ((local_2e0.rules.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_2).
                    _M_allocated_capacity != (_Manager_type)0x0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_318,(iterator)uVar4);
                }
              }
              else {
                _Var14 = std::
                         __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                   ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )uVar4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             )local_318._8_8_,__pred);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_318,(iterator)_Var14._M_current,(iterator)local_318._8_8_);
                if ((_Manager_type)
                    ((local_2e0.rules.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_2).
                    _M_allocated_capacity == (_Manager_type)0x0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_318,(const_iterator)local_318._0_8_,__pred._M_value);
                }
              }
              if (local_220._0_1_ == true) {
                local_220 = (_Invoker_type)((ulong)local_220 & 0xffffffffffffff00);
                std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                          ((vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *)
                           __return_storage_ptr__);
              }
LAB_005661f3:
              if ((_Manager_type)
                  ((local_2e0.rules.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_2).
                  _M_allocated_capacity != (_Manager_type)0x0) {
                std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&local_278,
                           (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)local_2e0.rules.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                uVar5 = local_318._8_8_;
                uVar4 = local_318._0_8_;
                std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)local_238,
                           (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&local_278);
                _Var14 = std::
                         remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<bool(std::__cxx11::string_const&)>>
                                   ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )uVar4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             )uVar5,
                                    (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)local_238);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_318,(iterator)_Var14._M_current,(iterator)local_318._8_8_);
                if ((pointer)local_238._16_8_ != (pointer)0x0) {
                  (*(code *)local_238._16_8_)
                            ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)local_238,
                             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)local_238,3);
                }
                if (local_268 != (code *)0x0) {
                  (*local_268)(&local_278,&local_278,__destroy_functor);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_318,(const_iterator)local_318._0_8_,__pred._M_value);
              }
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)local_2e0.paths.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                     __pred._M_value + 1);
              local_238._0_8_ =
                   (pmVar15->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
              local_238._8_8_ =
                   (pmVar15->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              local_238._16_8_ =
                   (pmVar15->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage;
              (pmVar15->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)local_318._0_8_;
              (pmVar15->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_318._8_8_;
              (pmVar15->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_318._16_8_;
              local_318._0_8_ = (pointer)0x0;
              local_318._8_8_ = (pointer)0x0;
              local_318._16_8_ = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_238);
            }
          }
        }
        else if (sVar1 == 4) {
          local_318._16_8_ = (pointer)0x0;
          local_318._8_8_ = (pointer)0x0;
          local_318._0_8_ = (pointer)0x0;
          iVar10 = bcmp(__s1,"msvc",4);
          if (iVar10 == 0) {
            std::ifstream::ifstream((istream *)local_238,(psVar13->_M_dataplus)._M_p,_S_in);
            if ((local_218[(long)(((pointer)(local_238._0_8_ + -0x30))->paths).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start] & 5) == 0) {
              local_2f0._0_8_ = &local_2e0;
              local_2f0._8_8_ = (cmGccStyleDependency *)0x0;
              local_2e0.rules.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
              if ((_Manager_type)
                  ((local_2e0.rules.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_2).
                  _M_allocated_capacity == (_Manager_type)0x0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_318,__pred._M_value);
              }
              while (bVar9 = cmsys::SystemTools::GetLineFromStream
                                       ((istream *)local_238,(string *)local_2f0,(bool *)0x0,
                                        0xffffffffffffffff), bVar9) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_318,(string *)local_2f0);
              }
              if ((cmGccStyleDependency *)local_2f0._0_8_ != &local_2e0) {
                operator_delete((void *)local_2f0._0_8_,
                                CONCAT71(local_2e0.rules.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_2e0.rules.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
              }
              std::ifstream::~ifstream((istream *)local_238);
              goto LAB_005661f3;
            }
            std::ifstream::~ifstream((istream *)local_238);
          }
        }
        else if ((sVar1 == 6) && (iVar10 = bcmp(__s1,"custom",6), iVar10 == 0)) {
          pcVar2 = (psVar13->_M_dataplus)._M_p;
          psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                              ((cmLocalGenerator *)
                               (local_2e0.paths.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                               _M_string_length);
          cmReadGccDepfile((optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                            *)local_2f0,pcVar2,psVar13,All);
          if (local_2e0.rules.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ != '\0') {
            local_280 = (cmGccStyleDependency *)local_2f0._8_8_;
            pcVar17 = (cmGccStyleDependency *)local_2f0._0_8_;
            if (local_2f0._0_8_ != local_2f0._8_8_) {
              do {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_318,&pcVar17->paths);
                if ((_Manager_type)
                    ((local_2e0.rules.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_2).
                    _M_allocated_capacity != (_Manager_type)0x0) {
                  std::
                  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_258,
                             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)local_2e0.rules.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  uVar5 = local_318._8_8_;
                  uVar4 = local_318._0_8_;
                  std::
                  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)local_238,
                             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_258);
                  _Var14 = std::
                           remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<bool(std::__cxx11::string_const&)>>
                                     ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       )uVar4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               )uVar5,
                                      (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                       *)local_238);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_318,(iterator)_Var14._M_current,(iterator)local_318._8_8_);
                  if ((pointer)local_238._16_8_ != (pointer)0x0) {
                    (*(code *)local_238._16_8_)
                              ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)local_238,
                               (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)local_238,3);
                  }
                  if (local_248 != (code *)0x0) {
                    (*local_248)(&local_258,&local_258,__destroy_functor);
                  }
                }
                lVar16 = (long)(pcVar17->rules).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pcVar17->rules).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                lVar18 = lVar16 >> 5;
                while( true ) {
                  __k = (pcVar17->rules).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
                  lVar18 = lVar18 + -1;
                  if (lVar18 == 0) break;
                  pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)local_2e0.paths.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                         (key_type *)((long)&__k[-1]._M_dataplus._M_p + lVar16));
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (pvVar12,*(undefined8 *)(pvVar12 + 8),local_318._0_8_);
                  lVar16 = lVar16 + -0x20;
                }
                pmVar15 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                        *)local_2e0.paths.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,__k);
                lVar16 = (long)(local_318._8_8_ - local_318._0_8_) >> 5;
                if (0 < lVar16) {
                  lVar16 = lVar16 + 1;
                  __x = (value_type *)local_318._0_8_;
                  do {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(pmVar15,__x);
                    __x = __x + 1;
                    lVar16 = lVar16 + -1;
                  } while (1 < lVar16);
                }
                pcVar17 = pcVar17 + 1;
              } while (pcVar17 != local_280);
            }
            if (local_2e0.rules.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ == '\x01') {
              local_2e0.rules.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
              __return_storage_ptr__ =
                   (optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                    *)local_2f0;
              goto LAB_00566133;
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_318);
        bVar9 = false;
        depFiles = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2e0.paths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
      }
      __pred._M_value = __pred._M_value + 4;
    } while (__pred._M_value != (pointer)((pointer)depFiles)->_M_string_length);
  }
  return bVar9;
}

Assistant:

bool cmDependsCompiler::CheckDependencies(
  const std::string& internalDepFile, const std::vector<std::string>& depFiles,
  cmDepends::DependencyMap& dependencies,
  const std::function<bool(const std::string&)>& isValidPath)
{
  bool status = true;
  bool forceReadDeps = true;

  cmFileTime internalDepFileTime;
  // read cached dependencies stored in internal file
  if (cmSystemTools::FileExists(internalDepFile)) {
    internalDepFileTime.Load(internalDepFile);
    forceReadDeps = false;

    // read current dependencies
    cmsys::ifstream fin(internalDepFile.c_str());
    if (fin) {
      std::string line;
      std::string depender;
      std::vector<std::string>* currentDependencies = nullptr;
      while (std::getline(fin, line)) {
        if (line.empty() || line.front() == '#') {
          continue;
        }
        // Drop carriage return character at the end
        if (line.back() == '\r') {
          line.pop_back();
          if (line.empty()) {
            continue;
          }
        }
        // Check if this a depender line
        if (line.front() != ' ') {
          depender = std::move(line);
          currentDependencies = &dependencies[depender];
          continue;
        }
        // This is a dependee line
        if (currentDependencies != nullptr) {
          currentDependencies->emplace_back(line.substr(1));
        }
      }
      fin.close();
    }
  }

  // Now, update dependencies map with all new compiler generated
  // dependencies files
  cmFileTime depFileTime;
  for (auto dep = depFiles.begin(); dep != depFiles.end(); dep++) {
    const auto& source = *dep++;
    const auto& target = *dep++;
    const auto& format = *dep++;
    const auto& depFile = *dep;

    if (!cmSystemTools::FileExists(depFile)) {
      continue;
    }

    if (!forceReadDeps) {
      depFileTime.Load(depFile);
    }
    if (forceReadDeps || depFileTime.Compare(internalDepFileTime) >= 0) {
      status = false;
      if (this->Verbose) {
        cmSystemTools::Stdout(cmStrCat("Dependencies file \"", depFile,
                                       "\" is newer than depends file \"",
                                       internalDepFile, "\".\n"));
      }

      std::vector<std::string> depends;
      if (format == "custom"_s) {
        auto deps = cmReadGccDepfile(
          depFile.c_str(), this->LocalGenerator->GetCurrentBinaryDirectory());
        if (!deps) {
          continue;
        }

        for (auto& entry : *deps) {
          depends = std::move(entry.paths);
          if (isValidPath) {
            cm::erase_if(depends, isValidPath);
          }
          // copy depends for each target, except first one, which can be
          // moved
          for (auto index = entry.rules.size() - 1; index > 0; --index) {
            auto& rule_deps = dependencies[entry.rules[index]];
            rule_deps.insert(rule_deps.end(), depends.cbegin(),
                             depends.cend());
          }
          auto& rule_deps = dependencies[entry.rules.front()];
          std::move(depends.cbegin(), depends.cend(),
                    std::back_inserter(rule_deps));
        }
      } else {
        if (format == "msvc"_s) {
          cmsys::ifstream fin(depFile.c_str());
          if (!fin) {
            continue;
          }

          std::string line;
          if (!isValidPath) {
            // insert source as first dependency
            depends.push_back(source);
          }
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            depends.emplace_back(std::move(line));
          }
        } else if (format == "gcc"_s) {
          auto deps = cmReadGccDepfile(
            depFile.c_str(), this->LocalGenerator->GetCurrentBinaryDirectory(),
            GccDepfilePrependPaths::Deps);
          if (!deps) {
            continue;
          }

          // dependencies generated by the compiler contains only one target
          depends = std::move(deps->front().paths);
          if (depends.empty()) {
            // unexpectedly empty, ignore it and continue
            continue;
          }

          // depending of the effective format of the dependencies file
          // generated by the compiler, the target can be wrongly identified
          // as a dependency so remove it from the list
          if (depends.front() == target) {
            depends.erase(depends.begin());
          }

          // ensure source file is the first dependency
          if (depends.front() != source) {
            cm::erase(depends, source);
            if (!isValidPath) {
              depends.insert(depends.begin(), source);
            }
          } else if (isValidPath) {
            // remove first dependency because it must not be filtered out
            depends.erase(depends.begin());
          }
        } else {
          // unknown format, ignore it
          continue;
        }

        if (isValidPath) {
          cm::erase_if(depends, isValidPath);
          // insert source as first dependency
          depends.insert(depends.begin(), source);
        }

        dependencies[target] = std::move(depends);
      }
    }
  }

  return status;
}